

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_suite.cpp
# Opt level: O3

void wostringstream_suite::test_view(void)

{
  int iVar1;
  bool v;
  wstring input;
  wostringstream output;
  undefined1 local_1c9;
  wchar_t *local_1c8;
  size_t local_1c0;
  long local_1b8 [2];
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  size_t local_1a0;
  long local_198 [2];
  long local_188 [4];
  int aiStack_168 [20];
  ios_base local_118 [264];
  
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_188);
  local_1c8 = (wchar_t *)local_1b8;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_1c8,L"alpha",L"");
  local_1a8 = *(int *)((long)aiStack_168 + *(long *)(local_188[0] + -0x18)) == 0;
  local_1c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("container.grow(input.size())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x78,"void wostringstream_suite::test_view()",&local_1a8,&local_1c9);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
            ((wostream *)local_188,local_1c8,local_1c0);
  std::__cxx11::wstringbuf::str();
  if (local_1a0 == local_1c0) {
    if (local_1a0 == 0) {
      v = true;
    }
    else {
      iVar1 = wmemcmp((wchar_t *)CONCAT71(uStack_1a7,local_1a8),local_1c8,local_1a0);
      v = iVar1 == 0;
    }
  }
  else {
    v = false;
  }
  boost::detail::test_impl
            ("output.str() == input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x7a,"void wostringstream_suite::test_view()",v);
  if ((long *)CONCAT71(uStack_1a7,local_1a8) != local_198) {
    operator_delete((long *)CONCAT71(uStack_1a7,local_1a8),local_198[0] * 4 + 4);
  }
  if (local_1c8 != (wchar_t *)local_1b8) {
    operator_delete(local_1c8,local_1b8[0] * 4 + 4);
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void test_view()
{
    std::wostringstream output;
    ostream_buffer<wchar_t> container(output);
    std::wstring input = L"alpha";
    TRIAL_PROTOCOL_TEST_EQUAL(container.grow(input.size()), true);
    TRIAL_PROTOCOL_TEST_NO_THROW(container.write(input));
    TRIAL_PROTOCOL_TEST(output.str() == input);
}